

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  stbi_uc *psVar5;
  bool bVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  stbi_uc sVar15;
  uint uVar16;
  stbi_uc *psVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long in_FS_OFFSET;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  byte local_a08 [31];
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_0013adaa:
    a->num_bits = 0;
    a->code_buffer = 0;
    do {
      iVar11 = 0x29c4a0;
      if (a->num_bits < 1) {
        stbi__fill_bits(a);
      }
      iVar21 = a->num_bits;
      uVar8 = a->code_buffer;
      a->code_buffer = uVar8 >> 1;
      a->num_bits = iVar21 + -1;
      if (iVar21 < 3) {
        stbi__fill_bits(a);
      }
      iVar21 = a->num_bits;
      uVar14 = a->code_buffer;
      a->code_buffer = uVar14 >> 2;
      a->num_bits = iVar21 - 2U;
      iVar9 = 0;
      switch(uVar14 & 3) {
      case 0:
        uVar14 = iVar21 - 2U & 7;
        if (uVar14 != 0) {
          if (iVar21 < 2) {
            stbi__fill_bits(a);
          }
          a->code_buffer = a->code_buffer >> (sbyte)uVar14;
          a->num_bits = a->num_bits - uVar14;
        }
        iVar11 = a->num_bits;
        if (iVar11 < 1) {
          uVar19 = 0;
        }
        else {
          uVar14 = a->code_buffer;
          uVar19 = 0;
          iVar21 = iVar11;
          do {
            *(char *)((long)local_814.fast + uVar19) = (char)uVar14;
            uVar19 = uVar19 + 1;
            uVar14 = uVar14 >> 8;
            iVar11 = iVar21 + -8;
            bVar6 = 8 < iVar21;
            iVar21 = iVar11;
          } while (bVar6);
          a->code_buffer = uVar14;
          a->num_bits = iVar11;
        }
        if (iVar11 < 0) {
LAB_0013b698:
          pcVar12 = "zlib corrupt";
        }
        else {
          if ((uint)uVar19 < 4) {
            psVar17 = a->zbuffer;
            psVar5 = a->zbuffer_end;
            uVar19 = uVar19 & 0xffffffff;
            do {
              if (psVar17 < psVar5) {
                a->zbuffer = psVar17 + 1;
                sVar15 = *psVar17;
                psVar17 = psVar17 + 1;
              }
              else {
                sVar15 = '\0';
              }
              *(stbi_uc *)((long)local_814.fast + uVar19) = sVar15;
              uVar19 = uVar19 + 1;
            } while (uVar19 != 4);
          }
          if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) goto LAB_0013b698;
          uVar19 = (ulong)local_814.fast[0];
          if (a->zbuffer + uVar19 <= a->zbuffer_end) {
            if ((a->zout + uVar19 <= a->zout_end) ||
               (iVar11 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar11 != 0)) {
              memcpy(a->zout,a->zbuffer,uVar19);
              a->zbuffer = a->zbuffer + uVar19;
              a->zout = a->zout + uVar19;
              goto LAB_0013b66b;
            }
            goto LAB_0013ad7d;
          }
          pcVar12 = "read past buffer";
        }
        goto LAB_0013ad74;
      case 1:
        iVar21 = stbi__zbuild_huffman
                           (&a->z_length,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar21 == 0) {
          return 0;
        }
        psVar17 = 
        "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
        ;
        iVar21 = 0x20;
        break;
      case 2:
        if (iVar21 < 7) {
          stbi__fill_bits(a);
        }
        iVar11 = a->num_bits;
        uVar14 = a->code_buffer;
        a->code_buffer = uVar14 >> 5;
        a->num_bits = iVar11 + -5;
        if (iVar11 < 10) {
          stbi__fill_bits(a);
        }
        iVar11 = a->num_bits;
        uVar16 = a->code_buffer;
        a->code_buffer = uVar16 >> 5;
        a->num_bits = iVar11 + -5;
        if (iVar11 < 9) {
          stbi__fill_bits(a);
        }
        uVar14 = uVar14 & 0x1f;
        iVar11 = uVar14 + 0x101;
        iVar21 = (uVar16 & 0x1f) + 1;
        uVar16 = a->code_buffer;
        a->code_buffer = uVar16 >> 4;
        a->num_bits = a->num_bits + -4;
        local_a08[0] = 0;
        local_a08[1] = 0;
        local_a08[2] = 0;
        local_a08[3] = 0;
        local_a08[4] = 0;
        local_a08[5] = 0;
        local_a08[6] = 0;
        local_a08[7] = 0;
        local_a08[8] = 0;
        local_a08[9] = 0;
        local_a08[10] = 0;
        local_a08[0xb] = 0;
        local_a08[0xc] = 0;
        local_a08[0xd] = 0;
        local_a08[0xe] = 0;
        local_a08[0xf] = 0;
        local_a08[0x10] = 0;
        local_a08[0x11] = 0;
        local_a08[0x12] = 0;
        lVar23 = 0;
        do {
          if (a->num_bits < 3) {
            stbi__fill_bits(a);
          }
          uVar10 = a->code_buffer;
          a->code_buffer = uVar10 >> 3;
          a->num_bits = a->num_bits + -3;
          local_a08[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[lVar23]] =
               (byte)uVar10 & 7;
          lVar23 = lVar23 + 1;
        } while ((ulong)(uVar16 & 0xf) + 4 != lVar23);
        iVar9 = stbi__zbuild_huffman(&local_814,local_a08,0x13);
        if (iVar9 == 0) goto LAB_0013ad7d;
        iVar9 = iVar21 + iVar11;
        iVar22 = 0;
        while( true ) {
          if (iVar9 <= iVar22) break;
          if (a->num_bits < 0x10) {
            uVar16 = 0xffffffff;
            if (a->zbuffer < a->zbuffer_end) {
              stbi__fill_bits(a);
              goto LAB_0013afd3;
            }
          }
          else {
LAB_0013afd3:
            uVar10 = a->code_buffer;
            uVar7 = local_814.fast[uVar10 & 0x1ff];
            if (uVar7 == 0) {
              uVar7 = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
              uVar16 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
              uVar16 = (uVar16 >> 2 & 0x3333) + (uVar16 & 0x3333) * 4;
              uVar1 = (uVar16 >> 1 & 0x5555) + (uVar16 & 0x5555) * 2;
              lVar23 = 0;
              do {
                lVar18 = lVar23;
                lVar23 = lVar18 + 1;
              } while (local_814.maxcode[lVar18 + 10] <= (int)uVar1);
              uVar16 = 0xffffffff;
              if (((lVar18 + 10U < 0x10) &&
                  (lVar20 = (ulong)local_814.firstsymbol[lVar18 + 10] +
                            ((ulong)(uVar1 >> (7U - (char)lVar23 & 0x1f)) -
                            (ulong)local_814.firstcode[lVar18 + 10]), (int)lVar20 < 0x120)) &&
                 ((ulong)*(byte *)((long)&local_814 + lVar20 + 0x484) - 9 == lVar23)) {
                a->code_buffer = uVar10 >> ((byte)(lVar18 + 10U) & 0x1f);
                a->num_bits = (a->num_bits - (int)lVar23) + -9;
                uVar16 = (uint)*(ushort *)((long)&local_814 + lVar20 * 2 + 0x5a4);
              }
            }
            else {
              a->code_buffer = uVar10 >> ((byte)(uVar7 >> 9) & 0x1f);
              a->num_bits = a->num_bits - (uint)(uVar7 >> 9);
              uVar16 = uVar7 & 0x1ff;
            }
          }
          if (uVar16 < 0x13) {
            if ((int)uVar16 < 0x10) {
              lVar23 = (long)iVar22;
              iVar22 = iVar22 + 1;
              abStack_9e9[lVar23 + 1] = (char)uVar16;
            }
            else {
              iVar2 = a->num_bits;
              if (uVar16 != 0x11) {
                if (uVar16 != 0x10) {
                  if (iVar2 < 7) {
                    stbi__fill_bits(a);
                  }
                  uVar16 = a->code_buffer;
                  a->code_buffer = uVar16 >> 7;
                  a->num_bits = a->num_bits + -7;
                  uVar16 = (uVar16 & 0x7f) + 0xb;
                  goto LAB_0013b179;
                }
                if (iVar2 < 2) {
                  stbi__fill_bits(a);
                }
                uVar16 = a->code_buffer;
                a->code_buffer = uVar16 >> 2;
                a->num_bits = a->num_bits + -2;
                if (iVar22 != 0) {
                  uVar16 = (uVar16 & 3) + 3;
                  uVar10 = (uint)abStack_9e9[iVar22];
                  goto LAB_0013b17b;
                }
                *(char **)(in_FS_OFFSET + -0x30) = "bad codelengths";
                iVar22 = 0;
                goto LAB_0013b0c7;
              }
              if (iVar2 < 3) {
                stbi__fill_bits(a);
              }
              uVar16 = a->code_buffer;
              a->code_buffer = uVar16 >> 3;
              a->num_bits = a->num_bits + -3;
              uVar16 = (uVar16 & 7) + 3;
LAB_0013b179:
              uVar10 = 0;
LAB_0013b17b:
              if (iVar9 - iVar22 < (int)uVar16) goto LAB_0013b0b7;
              memset(abStack_9e9 + (long)iVar22 + 1,uVar10,(ulong)uVar16);
              iVar22 = iVar22 + uVar16;
            }
            bVar6 = true;
          }
          else {
LAB_0013b0b7:
            *(char **)(in_FS_OFFSET + -0x30) = "bad codelengths";
LAB_0013b0c7:
            bVar6 = false;
          }
          if (!bVar6) goto LAB_0013ad7d;
        }
        if (iVar9 != iVar22) {
          pcVar12 = "bad codelengths";
          goto LAB_0013ad74;
        }
        iVar11 = stbi__zbuild_huffman(&a->z_length,(stbi_uc *)((long)abStack_9e9 + 1),iVar11);
        if (iVar11 == 0) goto LAB_0013ad7d;
        psVar17 = asStack_8e7 + uVar14;
        iVar11 = 0;
        break;
      case 3:
        goto switchD_0013ae28_caseD_3;
      }
      iVar21 = stbi__zbuild_huffman(&a->z_distance,psVar17,iVar21);
      if (iVar21 == 0) goto LAB_0013ad7d;
      pcVar12 = a->zout;
      do {
        if (a->num_bits < 0x10) {
          uVar14 = 0xffffffff;
          if (a->zbuffer < a->zbuffer_end) {
            stbi__fill_bits(a);
            goto LAB_0013b228;
          }
        }
        else {
LAB_0013b228:
          uVar16 = a->code_buffer;
          uVar7 = (a->z_length).fast[uVar16 & 0x1ff];
          if (uVar7 == 0) {
            uVar7 = (ushort)uVar16 << 8 | (ushort)uVar16 >> 8;
            uVar14 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
            uVar14 = (uVar14 >> 2 & 0x3333) + (uVar14 & 0x3333) * 4;
            uVar10 = (uVar14 >> 1 & 0x5555) + (uVar14 & 0x5555) * 2;
            lVar23 = 0;
            do {
              lVar18 = lVar23;
              lVar23 = lVar18 + 1;
            } while ((a->z_length).maxcode[lVar18 + 10] <= (int)uVar10);
            uVar14 = 0xffffffff;
            if (((lVar18 + 10U < 0x10) &&
                (lVar20 = (ulong)(a->z_length).firstsymbol[lVar18 + 10] +
                          ((ulong)(uVar10 >> (7U - (char)lVar23 & 0x1f)) -
                          (ulong)(a->z_length).firstcode[lVar18 + 10]), (int)lVar20 < 0x120)) &&
               ((ulong)*(byte *)((long)a + lVar20 + 0x4b8) - 9 == lVar23)) {
              a->code_buffer = uVar16 >> ((byte)(lVar18 + 10U) & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar23) + -9;
              uVar14 = (uint)*(ushort *)((long)a + lVar20 * 2 + 0x5d8);
            }
          }
          else {
            a->code_buffer = uVar16 >> ((byte)(uVar7 >> 9) & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar7 >> 9);
            uVar14 = uVar7 & 0x1ff;
          }
        }
        if ((int)uVar14 < 0x100) {
          if ((int)uVar14 < 0) {
LAB_0013b51d:
            pcVar13 = "bad huffman code";
LAB_0013b524:
            *(char **)(in_FS_OFFSET + -0x30) = pcVar13;
LAB_0013b52d:
            bVar6 = false;
            iVar11 = 0;
          }
          else {
            if (a->zout_end <= pcVar12) {
              iVar21 = stbi__zexpand(a,pcVar12,1);
              if (iVar21 == 0) goto LAB_0013b52d;
              pcVar12 = a->zout;
            }
            *pcVar12 = (char)uVar14;
            pcVar12 = pcVar12 + 1;
            bVar6 = true;
          }
        }
        else if (uVar14 == 0x100) {
          a->zout = pcVar12;
          iVar11 = 1;
          bVar6 = false;
        }
        else {
          uVar19 = (ulong)(uVar14 - 0x101);
          uVar14 = stbi__zlength_base[uVar19];
          if (0xffffffffffffffeb < uVar19 - 0x1c) {
            iVar21 = stbi__zlength_extra[uVar19];
            if (a->num_bits < iVar21) {
              stbi__fill_bits(a);
            }
            uVar16 = a->code_buffer;
            a->code_buffer = uVar16 >> ((byte)iVar21 & 0x1f);
            a->num_bits = a->num_bits - iVar21;
            uVar14 = uVar14 + (~(-1 << ((byte)iVar21 & 0x1f)) & uVar16);
          }
          if (a->num_bits < 0x10) {
            uVar19 = 0xffffffff;
            if (a->zbuffer < a->zbuffer_end) {
              stbi__fill_bits(a);
              goto LAB_0013b3d5;
            }
          }
          else {
LAB_0013b3d5:
            uVar16 = a->code_buffer;
            uVar7 = (a->z_distance).fast[uVar16 & 0x1ff];
            if (uVar7 == 0) {
              uVar7 = (ushort)uVar16 << 8 | (ushort)uVar16 >> 8;
              uVar10 = (uVar7 & 0xf0f) << 4 | (uVar7 & 0xf0f0) >> 4;
              uVar10 = (uVar10 >> 2 & 0x3333) + (uVar10 & 0x3333) * 4;
              uVar10 = (uVar10 >> 1 & 0x5555) + (uVar10 & 0x5555) * 2;
              lVar23 = 0;
              do {
                lVar18 = lVar23;
                lVar23 = lVar18 + 1;
              } while ((a->z_distance).maxcode[lVar18 + 10] <= (int)uVar10);
              uVar19 = 0xffffffff;
              if (((lVar18 + 10U < 0x10) &&
                  (lVar20 = (ulong)(a->z_distance).firstsymbol[lVar18 + 10] +
                            ((ulong)(uVar10 >> (7U - (char)lVar23 & 0x1f)) -
                            (ulong)(a->z_distance).firstcode[lVar18 + 10]), (int)lVar20 < 0x120)) &&
                 ((ulong)*(byte *)((long)a + lVar20 + 0xc9c) - 9 == lVar23)) {
                a->code_buffer = uVar16 >> ((byte)(lVar18 + 10U) & 0x1f);
                a->num_bits = (a->num_bits - (int)lVar23) + -9;
                uVar19 = (ulong)*(ushort *)((long)a + lVar20 * 2 + 0xdbc);
              }
            }
            else {
              a->code_buffer = uVar16 >> ((byte)(uVar7 >> 9) & 0x1f);
              a->num_bits = a->num_bits - (uint)(uVar7 >> 9);
              uVar19 = (ulong)(uVar7 & 0x1ff);
            }
          }
          if ((int)uVar19 < 0) goto LAB_0013b51d;
          iVar21 = stbi__zdist_base[uVar19];
          if (0xffffffffffffffe5 < uVar19 - 0x1e) {
            iVar9 = stbi__zdist_extra[uVar19];
            if (a->num_bits < iVar9) {
              stbi__fill_bits(a);
            }
            uVar16 = a->code_buffer;
            a->code_buffer = uVar16 >> ((byte)iVar9 & 0x1f);
            a->num_bits = a->num_bits - iVar9;
            iVar21 = iVar21 + (~(-1 << ((byte)iVar9 & 0x1f)) & uVar16);
          }
          if ((long)pcVar12 - (long)a->zout_start < (long)iVar21) {
            pcVar13 = "bad dist";
            goto LAB_0013b524;
          }
          if (a->zout_end < pcVar12 + (int)uVar14) {
            iVar9 = stbi__zexpand(a,pcVar12,uVar14);
            if (iVar9 == 0) goto LAB_0013b52d;
            pcVar12 = a->zout;
          }
          lVar23 = -(long)iVar21;
          if (iVar21 == 1) {
            bVar6 = true;
            if (uVar14 != 0) {
              memset(pcVar12,(uint)(byte)pcVar12[lVar23],(ulong)uVar14);
              pcVar12 = pcVar12 + (ulong)(uVar14 - 1) + 1;
            }
          }
          else {
            bVar6 = true;
            for (; uVar14 != 0; uVar14 = uVar14 - 1) {
              *pcVar12 = pcVar12[lVar23];
              pcVar12 = pcVar12 + 1;
            }
          }
        }
      } while (bVar6);
      if (iVar11 == 0) {
        return 0;
      }
LAB_0013b66b:
    } while ((uVar8 & 1) == 0);
    iVar9 = 1;
  }
  else {
    pbVar3 = a->zbuffer;
    pbVar4 = a->zbuffer_end;
    uVar14 = 0;
    uVar8 = 0;
    if (pbVar3 < pbVar4) {
      a->zbuffer = pbVar3 + 1;
      uVar8 = (uint)*pbVar3;
    }
    pbVar3 = a->zbuffer;
    if (pbVar3 < pbVar4) {
      a->zbuffer = pbVar3 + 1;
      uVar14 = (uint)*pbVar3;
    }
    if ((a->zbuffer < pbVar4) && ((uVar8 << 8 | uVar14) * -0x42108421 < 0x8421085)) {
      if ((uVar14 & 0x20) == 0) {
        if ((uVar8 & 0xf) == 8) goto LAB_0013adaa;
        pcVar12 = "bad compression";
      }
      else {
        pcVar12 = "no preset dict";
      }
    }
    else {
      pcVar12 = "bad zlib header";
    }
LAB_0013ad74:
    *(char **)(in_FS_OFFSET + -0x30) = pcVar12;
LAB_0013ad7d:
    iVar9 = 0;
  }
switchD_0013ae28_caseD_3:
  return iVar9;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}